

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O1

void secp256k1_modinv64_mul_62
               (secp256k1_modinv64_signed62 *r,secp256k1_modinv64_signed62 *a,int alen,
               int64_t factor)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  secp256k1_ge *extraout_RDX;
  secp256k1_ge *a_00;
  secp256k1_ge *psVar8;
  secp256k1_ge *psVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  bool bVar17;
  byte bVar18;
  
  bVar18 = 0;
  lVar16 = 0;
  lVar13 = 0;
  uVar12 = 0;
  do {
    if (lVar16 < alen) {
      uVar6 = factor * a->v[lVar16];
      uVar7 = SUB168(SEXT816(factor) * SEXT816(a->v[lVar16]),8);
      lVar1 = (uVar7 ^ 0x7fffffffffffffff) - lVar13;
      lVar15 = (-0x8000000000000000 - uVar7) - (ulong)(uVar6 != 0);
      lVar2 = lVar13 - lVar15;
      bVar17 = (SBORROW8(uVar7 ^ 0x7fffffffffffffff,lVar13) !=
               SBORROW8(lVar1,(ulong)(~uVar6 < uVar12))) ==
               (long)(lVar1 - (ulong)(~uVar6 < uVar12)) < 0;
      if ((long)uVar7 < 0) {
        bVar17 = (SBORROW8(lVar13,lVar15) != SBORROW8(lVar2,(ulong)(uVar12 < -uVar6))) ==
                 (long)(lVar2 - (ulong)(uVar12 < -uVar6)) < 0;
      }
      if (!bVar17) {
        secp256k1_modinv64_mul_62_cold_1();
        goto LAB_0011d47a;
      }
      bVar17 = CARRY8(uVar12,uVar6);
      uVar12 = uVar12 + uVar6;
      lVar13 = lVar13 + uVar7 + (ulong)bVar17;
    }
    uVar6 = lVar13 << 2 | uVar12 >> 0x3e;
    r->v[lVar16] = uVar12 & 0x3fffffffffffffff;
    lVar13 = lVar13 >> 0x3e;
    lVar16 = lVar16 + 1;
    uVar12 = uVar6;
  } while (lVar16 != 4);
  if (4 < alen) {
    uVar12 = factor * a->v[4];
    bVar17 = CARRY8(uVar6,uVar12);
    uVar6 = uVar6 + uVar12;
    lVar13 = lVar13 + SUB168(SEXT816(factor) * SEXT816(a->v[4]),8) + (ulong)bVar17;
  }
  if (lVar13 + -1 + (ulong)(0x7fffffffffffffff < uVar6) == -1) {
    if (lVar13 == (long)uVar6 >> 0x3f) {
      r->v[4] = uVar6;
      return;
    }
  }
  else {
LAB_0011d47a:
    secp256k1_modinv64_mul_62_cold_3();
  }
  secp256k1_modinv64_mul_62_cold_2();
  if ((secp256k1_ge *)r == extraout_RDX) {
    secp256k1_scalar_split_lambda_cold_3();
  }
  else if ((secp256k1_ge *)a != extraout_RDX) {
    if (r != a) {
      iVar4 = (int)(extraout_RDX->x).n[0];
      uVar5 = iVar4 + 5;
      iVar4 = (iVar4 - (uVar5 / 0xd + (uVar5 / 0xd) * 0xc)) + 5;
      *(int *)(((secp256k1_ge *)a)->x).n = iVar4;
      uVar5 = (0xd - iVar4) * 9 + (int)(extraout_RDX->x).n[0];
      *(uint *)(((secp256k1_ge *)r)->x).n = uVar5 - (uVar5 / 0xd + (uVar5 / 0xd) * 0xc);
      return;
    }
    goto LAB_0011d4e2;
  }
  secp256k1_scalar_split_lambda_cold_2();
LAB_0011d4e2:
  secp256k1_scalar_split_lambda_cold_1();
  uVar5 = (uint)(((secp256k1_ge *)a)->x).n[0];
  a_00 = (secp256k1_ge *)(ulong)uVar5;
  uVar11 = ((uVar5 & 1) == (uint)(6 < uVar5)) + uVar5;
  if (uVar11 < 0xd) {
    uVar10 = 0xd - uVar11;
    if (uVar11 == 0) {
      uVar10 = uVar11;
    }
    lVar13 = 0;
    if (uVar5 < 7) {
      uVar10 = uVar11;
    }
    uVar11 = (uVar5 < 7) - 1 | 1;
    a_00 = (secp256k1_ge *)(ulong)uVar11;
    uVar5 = uVar10 & 7;
    do {
      uVar3 = uVar10;
      if (uVar5 == 0) {
        secp256k1_wnaf_const_cold_4();
LAB_0011d593:
        secp256k1_wnaf_const_cold_3();
        goto LAB_0011d598;
      }
      if ((uVar5 & 1) == 0) goto LAB_0011d593;
      uVar10 = uVar3 >> 3;
      uVar14 = (uVar10 & 7) + (~uVar10 & 1);
      *(uint *)((long)(((secp256k1_ge *)r)->x).n + lVar13 * 4) =
           (uVar5 + (~uVar10 & 1) * -8) * uVar11;
      lVar13 = lVar13 + 1;
      uVar5 = uVar14;
    } while (lVar13 != 0x2b);
    *(uint *)((long)(((secp256k1_ge *)((long)r + 0x68))->y).n + 0x14) = uVar14 * uVar11;
    if (uVar3 < 0x40) {
      return;
    }
  }
  else {
LAB_0011d598:
    secp256k1_wnaf_const_cold_1();
  }
  secp256k1_wnaf_const_cold_2();
  psVar8 = a_00;
  psVar9 = (secp256k1_ge *)r;
  for (lVar13 = 0xd; lVar13 != 0; lVar13 = lVar13 + -1) {
    (psVar9->x).n[0] = (psVar8->x).n[0];
    psVar8 = (secp256k1_ge *)((long)psVar8 + (ulong)bVar18 * -0x10 + 8);
    psVar9 = (secp256k1_ge *)((long)psVar9 + (ulong)bVar18 * -0x10 + 8);
  }
  secp256k1_ge_verify(a_00);
  secp256k1_fe_mul((secp256k1_fe *)r,(secp256k1_fe *)r,&secp256k1_const_beta);
  secp256k1_ge_verify((secp256k1_ge *)r);
  return;
}

Assistant:

static void secp256k1_modinv64_mul_62(secp256k1_modinv64_signed62 *r, const secp256k1_modinv64_signed62 *a, int alen, int64_t factor) {
    const uint64_t M62 = UINT64_MAX >> 2;
    secp256k1_int128 c, d;
    int i;
    secp256k1_i128_from_i64(&c, 0);
    for (i = 0; i < 4; ++i) {
        if (i < alen) secp256k1_i128_accum_mul(&c, a->v[i], factor);
        r->v[i] = secp256k1_i128_to_u64(&c) & M62; secp256k1_i128_rshift(&c, 62);
    }
    if (4 < alen) secp256k1_i128_accum_mul(&c, a->v[4], factor);
    secp256k1_i128_from_i64(&d, secp256k1_i128_to_i64(&c));
    VERIFY_CHECK(secp256k1_i128_eq_var(&c, &d));
    r->v[4] = secp256k1_i128_to_i64(&c);
}